

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  int count;
  
  if (this->next_chunk_ == this->buffer_) {
    count = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  }
  else {
    count = (*(int *)&this->buffer_end_ - (int)ptr) + this->size_;
  }
  if (count < 1) {
    return;
  }
  StreamBackUp(this,count);
  return;
}

Assistant:

void BackUp(const char* ptr) {
    GOOGLE_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }